

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O2

void insert_msg(borg_read_messages *msgs,borg_read_message *msg,wchar_t spell_number)

{
  uint uVar1;
  char *pcVar2;
  char *__s2;
  char *pcVar3;
  int iVar4;
  borg_read_message *pbVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  
  if (msgs->messages == (borg_read_message *)0x0) {
    msgs->allocated = 10;
    pbVar5 = (borg_read_message *)mem_alloc(0xf0);
    msgs->messages = pbVar5;
    piVar6 = (int *)mem_alloc((long)msgs->allocated << 2);
    msgs->index = piVar6;
  }
  if (msg == (borg_read_message *)0x0) {
    pbVar5 = msgs->messages;
    iVar4 = msgs->count;
    lVar9 = (long)iVar4;
    pbVar5[lVar9].message_p3 = (char *)0x0;
    pbVar5[lVar9].message_p1 = (char *)0x0;
    pbVar5[lVar9].message_p2 = (char *)0x0;
    msgs->count = iVar4 + 1;
    pbVar5 = (borg_read_message *)mem_realloc(pbVar5,lVar9 * 0x18 + 0x18);
    msgs->messages = pbVar5;
    piVar6 = (int *)mem_realloc(msgs->index,(long)msgs->count << 2);
    msgs->index = piVar6;
    msgs->allocated = msgs->count;
  }
  else {
    uVar1 = msgs->count;
    lVar9 = 0;
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    pbVar5 = msgs->messages;
    for (; uVar7 * 0x18 - lVar9 != 0; lVar9 = lVar9 + 0x18) {
      pcVar2 = *(char **)((long)&pbVar5->message_p1 + lVar9);
      __s2 = msg->message_p1;
      if (pcVar2 == (char *)0x0) {
        if (__s2 == (char *)0x0) goto LAB_0022567f;
      }
      else if ((__s2 != (char *)0x0) && (iVar4 = strcmp(pcVar2,__s2), iVar4 == 0)) {
LAB_0022567f:
        pcVar2 = *(char **)((long)&pbVar5->message_p2 + lVar9);
        pcVar3 = msg->message_p2;
        if (pcVar2 == (char *)0x0) {
          if (pcVar3 == (char *)0x0) goto LAB_002256a2;
        }
        else if ((pcVar3 != (char *)0x0) && (iVar4 = strcmp(pcVar2,pcVar3), iVar4 == 0)) {
LAB_002256a2:
          pcVar2 = *(char **)((long)&pbVar5->message_p3 + lVar9);
          pcVar3 = msg->message_p3;
          if (pcVar2 == (char *)0x0) {
            if (pcVar3 == (char *)0x0) goto LAB_00225786;
          }
          else if ((pcVar3 != (char *)0x0) && (iVar4 = strcmp(pcVar2,pcVar3), iVar4 == 0)) {
LAB_00225786:
            string_free(__s2);
            string_free(msg->message_p2);
            string_free(msg->message_p3);
            return;
          }
        }
      }
    }
    pbVar5[(int)uVar1].message_p3 = msg->message_p3;
    pcVar2 = msg->message_p2;
    pbVar5[(int)uVar1].message_p1 = msg->message_p1;
    pbVar5[(int)uVar1].message_p2 = pcVar2;
    msgs->index[msgs->count] = spell_number;
    iVar4 = msgs->count;
    iVar8 = iVar4 + 1;
    msgs->count = iVar8;
    if (iVar8 == msgs->allocated) {
      lVar9 = (long)iVar4 + 0xb;
      msgs->allocated = (int)lVar9;
      pbVar5 = (borg_read_message *)mem_realloc(msgs->messages,lVar9 * 0x18);
      msgs->messages = pbVar5;
      piVar6 = (int *)mem_realloc(msgs->index,(long)msgs->allocated << 2);
      msgs->index = piVar6;
    }
  }
  return;
}

Assistant:

static void insert_msg(struct borg_read_messages *msgs,
    struct borg_read_message *msg, int spell_number)
{
    int  i;
    bool found_dup = false;

    /* this way we don't have to pre-create the array */
    if (msgs->messages == NULL) {
        msgs->allocated = 10;
        msgs->messages
            = mem_alloc(sizeof(struct borg_read_message) * msgs->allocated);
        msgs->index = mem_alloc(sizeof(int) * msgs->allocated);
    }

    if (msg == NULL) {
        msgs->messages[msgs->count].message_p1 = NULL;
        msgs->messages[msgs->count].message_p2 = NULL;
        msgs->messages[msgs->count].message_p3 = NULL;
        msgs->count++;
        /* shrink array down, we are done*/
        msgs->messages = mem_realloc(
            msgs->messages, sizeof(struct borg_read_message) * msgs->count);
        msgs->index     = mem_realloc(msgs->index, sizeof(int) * msgs->count);
        msgs->allocated = msgs->count;
        return;
    }

    for (i = 0; i < msgs->count; i++) {
        if (borg_read_message_equal(&msgs->messages[i], msg)) {
            found_dup = true;
            break;
        }
    }
    if (!found_dup) {
        memcpy(&(msgs->messages[msgs->count]), msg,
            sizeof(struct borg_read_message));
        msgs->index[msgs->count] = spell_number;
        msgs->count++;
        if (msgs->count == msgs->allocated) {
            msgs->allocated += 10;
            msgs->messages = mem_realloc(msgs->messages,
                sizeof(struct borg_read_message) * msgs->allocated);
            msgs->index
                = mem_realloc(msgs->index, sizeof(int) * msgs->allocated);
        }
    } else {
        string_free(msg->message_p1);
        string_free(msg->message_p2);
        string_free(msg->message_p3);
    }
}